

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator<
               (Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                *c1,Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                    *c2)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> entries1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> entries2;
  uint local_94;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_90;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  bVar2 = false;
  if (c1 != c2) {
    p_Var3 = (c1->column_)._M_h._M_before_begin._M_nxt;
    p_Var4 = (c2->column_)._M_h._M_before_begin._M_nxt;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (p_Var4 != (_Hash_node_base *)0x0 && p_Var3 != (_Hash_node_base *)0x0) {
      do {
        local_94 = *(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_90,&local_94);
        local_94 = *(uint *)((long)&(p_Var4[1]._M_nxt)->_M_nxt + 4);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_60,&local_94);
        p_Var3 = p_Var3->_M_nxt;
        p_Var4 = p_Var4->_M_nxt;
        if (p_Var3 == (_Hash_node_base *)0x0) break;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    if (p_Var3 != (_Hash_node_base *)0x0) {
      do {
        local_94 = *(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_90,&local_94);
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        local_94 = *(uint *)((long)&(p_Var4[1]._M_nxt)->_M_nxt + 4);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_60,&local_94);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    bVar2 = std::
            __lexicographical_compare_impl<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_90._M_impl.super__Rb_tree_header,
                       local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_90);
  }
  return bVar2;
}

Assistant:

bool operator<(const Unordered_set_column& c1, const Unordered_set_column& c2) {
    if (&c1 == &c2) return false;

    using ID_index = Unordered_set_column<Master_matrix>::ID_index;
    using Entry_rep =
        typename std::conditional<Master_matrix::Option_list::is_z2,
                                  ID_index,
                                  std::pair<ID_index, unsigned int>
                                 >::type;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    std::set<Entry_rep> entries1, entries2;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries1.insert((*it1)->get_row_index());
        entries2.insert((*it2)->get_row_index());
      } else {
        entries1.emplace((*it1)->get_row_index(), (*it1)->get_element());
        entries2.emplace((*it2)->get_row_index(), (*it2)->get_element());
      }
      ++it1;
      ++it2;
    }
    while (it1 != c1.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries1.insert((*it1)->get_row_index());
      } else {
        entries1.emplace((*it1)->get_row_index(), (*it1)->get_element());
      }
      ++it1;
    }
    while (it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries2.insert((*it2)->get_row_index());
      } else {
        entries2.emplace((*it2)->get_row_index(), (*it2)->get_element());
      }
      ++it2;
    }
    return entries1 < entries2;
  }